

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateStaticAssertions
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,string *title,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedStructs)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar1;
  reference pRVar2;
  pointer value;
  pointer value_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3f8;
  byte local_3b9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_378;
  string local_330;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_30b;
  undefined1 local_30a;
  allocator<char> local_309;
  string local_308;
  string local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  undefined1 local_280 [64];
  string local_240;
  allocator<char> local_219;
  undefined1 local_218 [8];
  string assertionTemplate_1;
  _Self local_1d8;
  _Self local_1d0;
  const_iterator structIt;
  string local_1c0;
  string local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 local_138 [64];
  string local_f8;
  allocator<char> local_d1;
  undefined1 local_d0 [8];
  string assertionTemplate;
  _Self local_98;
  const_iterator handleIt;
  NameLine *type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *__range2;
  RequireData *require;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *__range1;
  string str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *listedStructs_local;
  string *title_local;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *requireData_local;
  VulkanHppGenerator *this_local;
  
  str.field_2._8_8_ = listedStructs;
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           ::begin(requireData);
  require = (RequireData *)
            std::
            vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
            ::end(requireData);
  while (bVar1 = __gnu_cxx::
                 operator==<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                           (&__end1,(__normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                                     *)&require), ((bVar1 ^ 0xffU) & 1) != 0) {
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
             ::operator*(&__end1);
    __end2 = std::
             vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
             begin(&pRVar2->types);
    type = (NameLine *)
           std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
           ::end(&pRVar2->types);
    while (bVar1 = __gnu_cxx::
                   operator==<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                             (&__end2,(__normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                                       *)&type), ((bVar1 ^ 0xffU) & 1) != 0) {
      handleIt._M_node =
           (_Base_ptr)
           __gnu_cxx::
           __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
           ::operator*(&__end2);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
           ::find(&this->m_handles,(key_type *)handleIt._M_node);
      assertionTemplate.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
           ::end(&this->m_handles);
      bVar1 = std::operator==(&local_98,(_Self *)((long)&assertionTemplate.field_2 + 8));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_1d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
             ::find(&this->m_structs,handleIt._M_node);
        local_1d8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
             ::end(&this->m_structs);
        bVar1 = std::operator==(&local_1d0,&local_1d8);
        local_3b9 = 0;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pVar3 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)str.field_2._8_8_,(value_type *)handleIt._M_node);
          assertionTemplate_1.field_2._8_8_ = pVar3.first._M_node;
          local_3b9 = pVar3.second;
        }
        if ((local_3b9 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_218,
                     "\nVULKAN_HPP_STATIC_ASSERT( sizeof( VULKAN_HPP_NAMESPACE::${structureType} ) == sizeof( Vk${structureType} ), \"struct and wrapper have different size!\" );\nVULKAN_HPP_STATIC_ASSERT( std::is_standard_layout<VULKAN_HPP_NAMESPACE::${structureType}>::value, \"struct wrapper is not a standard layout!\" );\nVULKAN_HPP_STATIC_ASSERT( std::is_nothrow_move_constructible<VULKAN_HPP_NAMESPACE::${structureType}>::value, \"${structureType} is not nothrow_move_constructible!\" );\n"
                     ,&local_219);
          std::allocator<char>::~allocator(&local_219);
          local_30a = 1;
          local_2c8 = &local_2c0;
          value_00 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
                     ::operator->(&local_1d0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Vk",&local_309);
          stripPrefix(&local_2e8,&value_00->first,&local_308);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_2c0,(char (*) [14])"structureType",&local_2e8);
          local_30a = 0;
          local_280._0_8_ = &local_2c0;
          local_280._8_8_ = 1;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_30c);
          __l._M_len = local_280._8_8_;
          __l._M_array = (iterator)local_280._0_8_;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_280 + 0x10),__l,&local_30b,&local_30c);
          replaceWithMap(&local_240,(string *)local_218,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_280 + 0x10));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     &local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_280 + 0x10));
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator(&local_30c);
          local_3f8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_280;
          do {
            local_3f8 = local_3f8 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_3f8);
          } while (local_3f8 != &local_2c0);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
          std::allocator<char>::~allocator(&local_309);
          std::__cxx11::string::~string((string *)local_218);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d0,
                   "\nVULKAN_HPP_STATIC_ASSERT( sizeof( VULKAN_HPP_NAMESPACE::${className} ) == sizeof( Vk${className} ), \"handle and wrapper have different size!\" );\nVULKAN_HPP_STATIC_ASSERT( std::is_copy_constructible<VULKAN_HPP_NAMESPACE::${className}>::value, \"${className} is not copy_constructible!\" );\nVULKAN_HPP_STATIC_ASSERT( std::is_nothrow_move_constructible<VULKAN_HPP_NAMESPACE::${className}>::value, \"${className} is not nothrow_move_constructible!\" );\n"
                   ,&local_d1);
        std::allocator<char>::~allocator(&local_d1);
        structIt._M_node._6_1_ = 1;
        local_180 = &local_178;
        value = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>
                ::operator->(&local_98);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"Vk",(allocator<char> *)((long)&structIt._M_node + 7));
        stripPrefix(&local_1a0,&value->first,&local_1c0);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_178,(char (*) [10])"className",&local_1a0);
        structIt._M_node._6_1_ = 0;
        local_138._0_8_ = &local_178;
        local_138._8_8_ = 1;
        this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&structIt._M_node + 4);
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(this_00);
        __l_00._M_len = local_138._8_8_;
        __l_00._M_array = (iterator)local_138._0_8_;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_138 + 0x10),__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&structIt._M_node + 5),this_00);
        replaceWithMap(&local_f8,(string *)local_d0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_138 + 0x10));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                   &local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_138 + 0x10));
        std::
        allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&structIt._M_node + 4));
        local_378 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_138;
        do {
          local_378 = local_378 + -1;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(local_378);
        } while (local_378 != &local_178);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&structIt._M_node + 7));
        std::__cxx11::string::~string((string *)local_d0);
      }
      __gnu_cxx::
      __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)&local_330);
  addTitleAndProtection(__return_storage_ptr__,this,title,(string *)&__range1,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateStaticAssertions( std::vector<RequireData> const & requireData,
                                                          std::string const &              title,
                                                          std::set<std::string> &          listedStructs ) const
{
  std::string str;
  for ( auto const & require : requireData )
  {
    for ( auto const & type : require.types )
    {
      auto handleIt = m_handles.find( type.name );
      if ( handleIt != m_handles.end() )
      {
        std::string const assertionTemplate = R"(
VULKAN_HPP_STATIC_ASSERT( sizeof( VULKAN_HPP_NAMESPACE::${className} ) == sizeof( Vk${className} ), "handle and wrapper have different size!" );
VULKAN_HPP_STATIC_ASSERT( std::is_copy_constructible<VULKAN_HPP_NAMESPACE::${className}>::value, "${className} is not copy_constructible!" );
VULKAN_HPP_STATIC_ASSERT( std::is_nothrow_move_constructible<VULKAN_HPP_NAMESPACE::${className}>::value, "${className} is not nothrow_move_constructible!" );
)";
        str += replaceWithMap( assertionTemplate, { { "className", stripPrefix( handleIt->first, "Vk" ) } } );
      }
      else
      {
        auto structIt = m_structs.find( type.name );
        if ( ( structIt != m_structs.end() ) && listedStructs.insert( type.name ).second )
        {
          std::string const assertionTemplate = R"(
VULKAN_HPP_STATIC_ASSERT( sizeof( VULKAN_HPP_NAMESPACE::${structureType} ) == sizeof( Vk${structureType} ), "struct and wrapper have different size!" );
VULKAN_HPP_STATIC_ASSERT( std::is_standard_layout<VULKAN_HPP_NAMESPACE::${structureType}>::value, "struct wrapper is not a standard layout!" );
VULKAN_HPP_STATIC_ASSERT( std::is_nothrow_move_constructible<VULKAN_HPP_NAMESPACE::${structureType}>::value, "${structureType} is not nothrow_move_constructible!" );
)";
          str += replaceWithMap( assertionTemplate, { { "structureType", stripPrefix( structIt->first, "Vk" ) } } );
        }
      }
    }
  }
  return addTitleAndProtection( title, str );
}